

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hpp
# Opt level: O2

void __thiscall FunctionSymbol::~FunctionSymbol(FunctionSymbol *this)

{
  ~FunctionSymbol(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

FunctionSymbol(const std::string& name, const TypeName& returnType, 
    const std::list<TypeName>& arguments):
      name_(name), returnType_(returnType), arguments_(arguments) {}